

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int file_read_privatekey
              (LIBSSH2_SESSION *session,LIBSSH2_HOSTKEY_METHOD **hostkey_method,
              void **hostkey_abstract,uchar *method,size_t method_len,char *privkeyfile,
              char *passphrase)

{
  LIBSSH2_HOSTKEY_METHOD *pLVar1;
  int iVar2;
  LIBSSH2_HOSTKEY_METHOD **ppLVar3;
  char *errmsg;
  
  ppLVar3 = libssh2_hostkey_methods();
  *hostkey_method = (LIBSSH2_HOSTKEY_METHOD *)0x0;
  *hostkey_abstract = (void *)0x0;
  pLVar1 = *ppLVar3;
  do {
    if (pLVar1 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
LAB_0012db02:
      if (*hostkey_method == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
        errmsg = "No handler for specified private key";
        iVar2 = -0x11;
      }
      else {
        iVar2 = (*(*hostkey_method)->initPEM)
                          (session,privkeyfile,(uchar *)passphrase,hostkey_abstract);
        if (iVar2 == 0) {
          return 0;
        }
        errmsg = "Unable to initialize private key from file";
        iVar2 = -0x10;
      }
      iVar2 = _libssh2_error(session,iVar2,errmsg);
      return iVar2;
    }
    ppLVar3 = ppLVar3 + 1;
    if (pLVar1->name == (char *)0x0) goto LAB_0012db02;
    if ((pLVar1->initPEM != (_func_int_LIBSSH2_SESSION_ptr_char_ptr_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar2 = strncmp(pLVar1->name,(char *)method,method_len), iVar2 == 0)) {
      *hostkey_method = pLVar1;
      goto LAB_0012db02;
    }
    pLVar1 = *ppLVar3;
  } while( true );
}

Assistant:

static int
file_read_privatekey(LIBSSH2_SESSION * session,
                     const LIBSSH2_HOSTKEY_METHOD ** hostkey_method,
                     void **hostkey_abstract,
                     const unsigned char *method, size_t method_len,
                     const char *privkeyfile, const char *passphrase)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail =
        libssh2_hostkey_methods();

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                   "Loading private key file: %s", privkeyfile));
    *hostkey_method = NULL;
    *hostkey_abstract = NULL;
    while(*hostkey_methods_avail && (*hostkey_methods_avail)->name) {
        if((*hostkey_methods_avail)->initPEM
            && strncmp((*hostkey_methods_avail)->name, (const char *) method,
                       method_len) == 0) {
            *hostkey_method = *hostkey_methods_avail;
            break;
        }
        hostkey_methods_avail++;
    }
    if(!*hostkey_method) {
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                              "No handler for specified private key");
    }

    if((*hostkey_method)->
        initPEM(session, privkeyfile, (unsigned char *) passphrase,
                hostkey_abstract)) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to initialize private key from file");
    }

    return 0;
}